

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_quad_rule.cc
# Opt level: O3

QuadRule * lf::quad::make_TriaQR_P6O4(void)

{
  Scalar *pSVar1;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar2;
  Index index;
  ulong uVar3;
  long lVar4;
  QuadRule *in_RDI;
  undefined1 auVar5 [16];
  MatrixXd points;
  VectorXd weights;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_d8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_b8;
  scalar_constant_op<double> local_a0;
  VectorXd local_98;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_88;
  double local_68;
  undefined8 uStack_60;
  MatrixXd local_58;
  Scalar local_40;
  Scalar local_38;
  Scalar local_30;
  Scalar local_28;
  Scalar local_20;
  
  local_d8.m_storage.m_data = (double *)0x0;
  local_d8.m_storage.m_rows = 0;
  local_d8.m_storage.m_cols = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize(&local_d8,2,6);
  local_b8.m_storage.m_data = (double *)0x0;
  local_b8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_b8,6);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_d8,0,0)
  ;
  *pSVar1 = 0.5;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_d8,1,0)
  ;
  *pSVar1 = 0.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_d8,0,1)
  ;
  *pSVar1 = 0.5;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_d8,1,1)
  ;
  *pSVar1 = 0.5;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_d8,0,2)
  ;
  *pSVar1 = 0.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_d8,1,2)
  ;
  *pSVar1 = 0.5;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_d8,0,3)
  ;
  *pSVar1 = 0.16666666666666666;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_d8,1,3)
  ;
  *pSVar1 = 0.16666666666666666;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_d8,0,4)
  ;
  *pSVar1 = 0.16666666666666666;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_d8,1,4)
  ;
  *pSVar1 = 0.6666666666666666;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_d8,0,5)
  ;
  *pSVar1 = 0.6666666666666666;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_d8,1,5)
  ;
  *pSVar1 = 0.16666666666666666;
  local_a0.m_other = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::CommaInitializer
            (&local_88,(Matrix<double,__1,_1,_0,__1,_1> *)&local_b8,&local_a0.m_other);
  local_20 = 1.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (&local_88,&local_20);
  local_28 = 1.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar2,&local_28);
  local_30 = 9.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar2,&local_30);
  local_38 = 9.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar2,&local_38);
  local_40 = 9.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar2,&local_40);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished(&local_88);
  local_a0.m_other = 60.0;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)&local_88,local_b8.m_storage.m_rows,1,&local_a0);
  local_68 = (double)local_88.m_col;
  uStack_60 = 0;
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::internal::div_assign_op<double,double>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_b8,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)&local_88,(div_assign_op<double,_double> *)&local_a0);
  uVar3 = local_b8.m_storage.m_rows - (local_b8.m_storage.m_rows >> 0x3f) & 0xfffffffffffffffe;
  if (1 < local_b8.m_storage.m_rows) {
    lVar4 = 0;
    do {
      auVar5._8_8_ = local_68;
      auVar5._0_8_ = local_68;
      auVar5 = divpd(*(undefined1 (*) [16])(local_b8.m_storage.m_data + lVar4),auVar5);
      *(undefined1 (*) [16])(local_b8.m_storage.m_data + lVar4) = auVar5;
      lVar4 = lVar4 + 2;
    } while (lVar4 < (long)uVar3);
  }
  if ((long)uVar3 < local_b8.m_storage.m_rows) {
    do {
      local_b8.m_storage.m_data[uVar3] = local_b8.m_storage.m_data[uVar3] / local_68;
      uVar3 = uVar3 + 1;
    } while (local_b8.m_storage.m_rows != uVar3);
  }
  local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       local_d8.m_storage.m_data;
  local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       local_d8.m_storage.m_rows;
  local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       local_d8.m_storage.m_cols;
  local_d8.m_storage.m_data = (double *)0x0;
  local_d8.m_storage.m_rows = 0;
  local_d8.m_storage.m_cols = 0;
  local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       local_b8.m_storage.m_data;
  local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       local_b8.m_storage.m_rows;
  local_b8.m_storage.m_data = (double *)0x0;
  local_b8.m_storage.m_rows = 0;
  QuadRule::QuadRule(in_RDI,(RefEl)0x3,&local_58,&local_98,3);
  free(local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_b8.m_storage.m_data);
  free(local_d8.m_storage.m_data);
  return in_RDI;
}

Assistant:

QuadRule make_TriaQR_P6O4() {
  Eigen::MatrixXd points(2, 6);
  Eigen::VectorXd weights(6);

  points(0, 0) = 0.5;
  points(1, 0) = 0.0;
  points(0, 1) = 0.5;
  points(1, 1) = 0.5;
  points(0, 2) = 0.0;
  points(1, 2) = 0.5;
  points(0, 3) = 1.0 / 6.0;
  points(1, 3) = 1.0 / 6.0;
  points(0, 4) = 1.0 / 6.0;
  points(1, 4) = 2.0 / 3.0;
  points(0, 5) = 2.0 / 3.0;
  points(1, 5) = 1.0 / 6.0;

  weights << 1.0, 1.0, 1.0, 9.0, 9.0, 9.0;
  weights /= 60.0;

  return QuadRule(base::RefEl::kTria(), std::move(points), std::move(weights),
                  3);
}